

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlFileRead(void *context,char *buffer,int len)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  
  sVar3 = 0xffffffff;
  if (buffer != (char *)0x0 && context != (void *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    sVar3 = fread(buffer,1,(long)len,(FILE *)context);
    if (sVar3 < (ulong)(long)len) {
      iVar1 = ferror((FILE *)context);
      if (iVar1 != 0) {
        iVar1 = xmlIOErr(*piVar2);
        sVar3 = (size_t)(uint)-iVar1;
      }
    }
  }
  return (int)sVar3;
}

Assistant:

int
xmlFileRead(void * context, char * buffer, int len) {
    FILE *file = context;
    size_t bytes;

    if ((context == NULL) || (buffer == NULL))
        return(-1);

    /*
     * The C standard doesn't mandate that fread sets errno, only
     * POSIX does. The Windows documentation isn't really clear.
     * Set errno to zero which will be reported as unknown error
     * if fread fails without setting errno.
     */
    errno = 0;
    bytes = fread(buffer, 1, len, file);
    if ((bytes < (size_t) len) && (ferror(file)))
        return(-xmlIOErr(errno));

    return(bytes);
}